

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.h
# Opt level: O0

BasicTypeInfo<dap::optional<std::vector<dap::integer,_std::allocator<dap::integer>_>_>_> *
dap::TypeInfo::
create<dap::BasicTypeInfo<dap::optional<std::vector<dap::integer,std::allocator<dap::integer>>>>,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  BasicTypeInfo<dap::optional<std::vector<dap::integer,_std::allocator<dap::integer>_>_>_> *this;
  BasicTypeInfo<dap::optional<std::vector<dap::integer,_std::allocator<dap::integer>_>_>_> *typeinfo
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  this = (BasicTypeInfo<dap::optional<std::vector<dap::integer,_std::allocator<dap::integer>_>_>_> *
         )operator_new(0x28);
  BasicTypeInfo<dap::optional<std::vector<dap::integer,_std::allocator<dap::integer>_>_>_>::
  BasicTypeInfo(this,args);
  deleteOnExit((TypeInfo *)this);
  return this;
}

Assistant:

static T* create(ARGS&&... args) {
    auto typeinfo = new T(std::forward<ARGS>(args)...);
    deleteOnExit(typeinfo);
    return typeinfo;
  }